

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O0

int CheckFromArray(void)

{
  _Bool _Var1;
  FILE *__stream;
  _Bool passed;
  FILE *out;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    _Var1 = Check(testInOut[testN].out1,testInOut[testN].out2,(FILE *)__stream);
    fclose(__stream);
    if (_Var1) {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
    else {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void) {
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    bool passed = Check(testInOut[testN].out1, testInOut[testN].out2, out);
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}